

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int propagateConstantExprRewriteOne(WhereConst *pConst,Expr *pExpr,int bIgnoreAffBlob)

{
  char cVar1;
  Expr *pEVar2;
  Expr *pColumn;
  int i;
  int bIgnoreAffBlob_local;
  Expr *pExpr_local;
  WhereConst *pConst_local;
  
  if (*pConst->pOomFault == '\0') {
    if (pExpr->op == 0xa7) {
      if ((pExpr->flags & (pConst->mExcludeOn | 0x20)) == 0) {
        for (pColumn._0_4_ = 0; (int)pColumn < pConst->nConst; pColumn._0_4_ = (int)pColumn + 1) {
          pEVar2 = pConst->apExpr[(int)pColumn << 1];
          if (((pEVar2 != pExpr) && (pEVar2->iTable == pExpr->iTable)) &&
             (pEVar2->iColumn == pExpr->iColumn)) {
            if ((bIgnoreAffBlob == 0) || (cVar1 = sqlite3ExprAffinity(pEVar2), cVar1 != 'A')) {
              pConst->nChng = pConst->nChng + 1;
              pExpr->flags = pExpr->flags & 0xff7fffff;
              pExpr->flags = pExpr->flags | 0x20;
              pEVar2 = sqlite3ExprDup(pConst->pParse->db,pConst->apExpr[(int)pColumn * 2 + 1],0);
              pExpr->pLeft = pEVar2;
              if (pConst->pParse->db->mallocFailed != '\0') {
                return 1;
              }
            }
            break;
          }
        }
        pConst_local._4_4_ = 1;
      }
      else {
        pConst_local._4_4_ = 0;
      }
    }
    else {
      pConst_local._4_4_ = 0;
    }
  }
  else {
    pConst_local._4_4_ = 1;
  }
  return pConst_local._4_4_;
}

Assistant:

static int propagateConstantExprRewriteOne(
  WhereConst *pConst,
  Expr *pExpr,
  int bIgnoreAffBlob
){
  int i;
  if( pConst->pOomFault[0] ) return WRC_Prune;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol|pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_FixedCol) );
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return WRC_Continue;
  }
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    if( bIgnoreAffBlob && sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
      break;
    }
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    if( pConst->pParse->db->mallocFailed ) return WRC_Prune;
    break;
  }
  return WRC_Prune;
}